

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

Value * __thiscall
cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  pointer pGVar1;
  Value *pVVar2;
  mapped_type *pmVar3;
  cmake *this_00;
  pointer value;
  __node_base _Var4;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value generators;
  JsonValueMapType generatorMap;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_1e8;
  Value local_1d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a8;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  this_00 = (cmake *)0x7;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ReportVersionJson(&local_120,this_00);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar2,&local_120);
  Json::Value::~Value(&local_120);
  local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&local_1e8,true);
  pGVar1 = local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._M_buckets = &local_1a8._M_single_bucket;
  local_1a8._M_bucket_count = 1;
  local_1a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a8._M_element_count = 0;
  local_1a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a8._M_rehash_policy._M_next_resize = 0;
  local_1a8._M_single_bucket = (__node_base_ptr)0x0;
  if (local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1e8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    value = local_1e8.
            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      if (value->isAlias == false) {
        if ((value->extraName)._M_string_length == 0) {
          Json::Value::Value(&local_1d0,objectValue);
          Json::Value::Value(&local_a8,&value->name);
          pVVar2 = Json::Value::operator[](&local_1d0,"name");
          Json::Value::operator=(pVVar2,&local_a8);
          Json::Value::~Value(&local_a8);
          Json::Value::Value(&local_d0,value->supportsToolset);
          pVVar2 = Json::Value::operator[](&local_1d0,"toolsetSupport");
          Json::Value::operator=(pVVar2,&local_d0);
          Json::Value::~Value(&local_d0);
          Json::Value::Value(&local_f8,value->supportsPlatform);
          pVVar2 = Json::Value::operator[](&local_1d0,"platformSupport");
          Json::Value::operator=(pVVar2,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::Value(&local_58,arrayValue);
          pVVar2 = Json::Value::operator[](&local_1d0,"extraGenerators");
          Json::Value::operator=(pVVar2,&local_58);
          Json::Value::~Value(&local_58);
          Json::Value::Value(&local_80,&local_1d0);
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_1a8,&value->name);
          Json::Value::operator=(pmVar3,&local_80);
          Json::Value::~Value(&local_80);
        }
        else {
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_1a8,&value->baseName);
          pVVar2 = Json::Value::operator[](pmVar3,"extraGenerators");
          Json::Value::Value(&local_1d0,&value->extraName);
          Json::Value::append(pVVar2,&local_1d0);
        }
        Json::Value::~Value(&local_1d0);
      }
      value = value + 1;
    } while (value != pGVar1);
  }
  Json::Value::Value(&local_1d0,arrayValue);
  if (local_1a8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var4._M_nxt = local_1a8._M_before_begin._M_nxt;
    do {
      Json::Value::append(&local_1d0,(Value *)(_Var4._M_nxt + 5));
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
  }
  Json::Value::Value(&local_148,&local_1d0);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar2,&local_148);
  Json::Value::~Value(&local_148);
  Json::Value::Value(&local_170,haveServerMode);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar2,&local_170);
  Json::Value::~Value(&local_170);
  Json::Value::~Value(&local_1d0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a8);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector(&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson(bool haveServerMode) const
{
  Json::Value obj = Json::objectValue;

  // Version information:
  obj["version"] = this->ReportVersionJson();

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (cmake::GeneratorInfo const& gi : generatorInfoList) {
    if (gi.isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (gi.extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = gi.name;
      gen["toolsetSupport"] = gi.supportsToolset;
      gen["platformSupport"] = gi.supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[gi.name] = gen;
    } else {
      Json::Value& gen = generatorMap[gi.baseName];
      gen["extraGenerators"].append(gi.extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (auto const& i : generatorMap) {
    generators.append(i.second);
  }
  obj["generators"] = generators;
  obj["serverMode"] = haveServerMode;

  return obj;
}